

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_headers.c
# Opt level: O1

int test_float(void)

{
  puts("\nVerifying assignment:");
  printf("b:   %f\n",0);
  printf("b2:  %f %f \n",0,0x3ff0000000000000);
  printf("b4:  %f %f %f %f\n",0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000);
  printf("b8:  %f %f %f %f %f %f %f %f\n",0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000
         ,0x4010000000000000,0x4014000000000000,0x4018000000000000,0x401c000000000000);
  printf("b16: %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f\n",0,0x3ff0000000000000,
         0x4000000000000000,0x4008000000000000,0x4010000000000000,0x4014000000000000,
         0x4018000000000000,0x401c000000000000);
  puts("\nVerifying vector access:");
  printf("__cl_float2:  %f %f \n",0,0x3ff0000000000000);
  printf("__cl_float4:  %f %f %f %f \n",0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000);
  puts("__cl_float8 SIMD vectors not supported on this architecture.");
  puts("__cl_float16 SIMD vectors not supported on this architecture.");
  putchar(10);
  return 0;
}

Assistant:

int test_float(void)
{
/* float */
    /* Constructor */
    cl_float a = 0.0f;
    cl_float2 a2 = {{ 0.0f, 1.0f }};
    cl_float4 a4 = {{ 0.0f, 1.0f, 2.0f, 3.0f }};
    cl_float8 a8 = {{ 0.0f, 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f, 7.0f }};
    cl_float16 a16 = {{ 0.0f, 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f, 7.0f, 8.0f, 9.0f, 10.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f }};

    /* assignment */
    cl_float    b = a;
    cl_float2   b2 = a2;
    cl_float4   b4 = a4;
    cl_float8   b8 = a8;
    cl_float16  b16 = a16;

    printf("\nVerifying assignment:\n" );
    printf("b:   %f\n", b );
    printf("b2:  %f %f \n", b2.s[0], b2.s[1] );
    printf("b4:  %f %f %f %f\n", b4.s[0], b4.s[1], b4.s[2], b4.s[3] );
    printf("b8:  %f %f %f %f %f %f %f %f\n", b8.s[0], b8.s[1], b8.s[2], b8.s[3], b8.s[4], b8.s[5], b8.s[6], b8.s[7] );
    printf("b16: %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f\n", b16.s[0], b16.s[1], b16.s[2], b16.s[3], b16.s[4], b16.s[5], b16.s[6], b16.s[7],
                                                                     b16.s[8], b16.s[9], b16.s[10], b16.s[11], b16.s[12], b16.s[13], b16.s[14], b16.s[15]);

    /* vector access */
    printf("\nVerifying vector access:\n" );
#if defined( __CL_FLOAT2__ )
    __cl_float2 v2 = b2.v2;
    printf("__cl_float2:  %f %f \n", ((cl_float*)&v2)[0], ((cl_float*)&v2)[1] );
#else
    printf( "__cl_float2 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_FLOAT4__ )
    {
        __cl_float4 v4 = b4.v4;
        printf("__cl_float4:  %f %f %f %f \n", ((cl_float*)&v4)[0], ((cl_float*)&v4)[1], ((cl_float*)&v4)[2], ((cl_float*)&v4)[3] );
    }
#else
    printf( "__cl_float4 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_FLOAT8__ )
    __cl_float8 v8 = b8.v8;
    printf("__cl_float8:  %f %f %f %f %f %f %f %f \n", ((cl_float*)&v8)[0], ((cl_float*)&v8)[1], ((cl_float*)&v8)[2], ((cl_float*)&v8)[3], ((cl_float*)&v8)[4], ((cl_float*)&v8)[5], ((cl_float*)&v8)[6], ((cl_float*)&v8)[7] );
#else
    printf( "__cl_float8 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_FLOAT16__ )
    __cl_float16 v16 = b16.v16;
    printf("__cl_float16: %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f \n", ((cl_float*)&v16)[0], ((cl_float*)&v16)[1], ((cl_float*)&v16)[2], ((cl_float*)&v16)[3], ((cl_float*)&v16)[4], ((cl_float*)&v16)[5], ((cl_float*)&v16)[6], ((cl_float*)&v16)[7],
                                                                      ((cl_float*)&v16)[8], ((cl_float*)&v16)[9], ((cl_float*)&v16)[10], ((cl_float*)&v16)[11], ((cl_float*)&v16)[12], ((cl_float*)&v16)[13], ((cl_float*)&v16)[14], ((cl_float*)&v16)[15]);
#else
    printf( "__cl_float16 SIMD vectors not supported on this architecture.\n" );
#endif

    printf( "\n" );
    return 0;
}